

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int read_mllr_files(char *mllrmatfn,char *cb2mllrfn,float32 *****out_A,float32 ****out_B,
                   int32 **out_cb2mllr,uint32 *out_n_mllr_class,uint32 *out_n_mgau,
                   uint32 *out_n_feat,uint32 **out_veclen,uint32 inverse)

{
  int32 iVar1;
  int iVar2;
  uint local_44;
  uint local_40;
  uint32 j;
  uint32 m;
  uint32 n_mllr_class_rd;
  uint32 *out_n_mllr_class_local;
  int32 **out_cb2mllr_local;
  float32 ****out_B_local;
  float32 *****out_A_local;
  char *cb2mllrfn_local;
  char *mllrmatfn_local;
  
  _m = out_n_mllr_class;
  out_n_mllr_class_local = (uint32 *)out_cb2mllr;
  out_cb2mllr_local = (int32 **)out_B;
  out_B_local = (float32 ****)out_A;
  out_A_local = (float32 *****)cb2mllrfn;
  cb2mllrfn_local = mllrmatfn;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
          ,0x48,"Read %s\n",mllrmatfn);
  iVar1 = read_reg_mat(cb2mllrfn_local,out_veclen,_m,out_n_feat,(float32 *****)out_B_local,
                       (float32 ****)out_cb2mllr_local);
  if (iVar1 != 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
            ,0x4f,"Unable to read %s\n",cb2mllrfn_local);
    exit(1);
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
          ,0x51,"n_mllr_class = %d\n",(ulong)*_m);
  if (inverse != 0) {
    for (local_40 = 0; local_40 < *_m; local_40 = local_40 + 1) {
      for (local_44 = 0; local_44 < *out_n_feat; local_44 = local_44 + 1) {
        invert((float32 **)(*out_B_local)[local_40][local_44],
               (float32 **)(*out_B_local)[local_40][local_44],(*out_veclen)[local_44]);
      }
    }
  }
  iVar2 = strcmp((char *)out_A_local,".1cls.");
  if (iVar2 == 0) {
    j = 1;
    out_n_mllr_class_local[0] = 0;
    out_n_mllr_class_local[1] = 0;
    *out_n_mgau = 0;
  }
  else {
    iVar2 = s3cb2mllr_read((char *)out_A_local,(int32 **)out_n_mllr_class_local,out_n_mgau,&j);
    if (iVar2 != 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
              ,0x65,"Unable to read %s\n",out_A_local);
      exit(1);
    }
  }
  if (j == *_m) {
    return 0;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
          ,0x6a,"# MLLR class, %u, inconsistent w/ cb2mllr # MLLR class, %u\n",(ulong)j,(ulong)*_m);
  exit(1);
}

Assistant:

static int
read_mllr_files(const char *mllrmatfn,
		const char *cb2mllrfn,
		float32 *****out_A,
		float32 ****out_B,
		int32 **out_cb2mllr,
		uint32 *out_n_mllr_class,
		uint32 *out_n_mgau,
		uint32 *out_n_feat,
		uint32 **out_veclen,
		uint32 inverse)
{
    uint32 n_mllr_class_rd, m, j;

    E_INFO("Read %s\n", mllrmatfn);
    if (read_reg_mat(mllrmatfn,
	 	     out_veclen,
		     out_n_mllr_class,
		     out_n_feat,
		     out_A,
		     out_B) != S3_SUCCESS) {
	E_FATAL("Unable to read %s\n",mllrmatfn);
    }
    E_INFO("n_mllr_class = %d\n", *out_n_mllr_class);

    if (inverse) {
	for (m = 0; m < *out_n_mllr_class; ++m) {
	    for (j = 0; j < *out_n_feat; ++j) {
		invert((*out_A)[m][j], (*out_A)[m][j], (*out_veclen)[j]);
	    }
	}
    }

    if (strcmp(cb2mllrfn, ".1cls.") == 0) {
	n_mllr_class_rd = 1;
        *out_cb2mllr = NULL;
	*out_n_mgau = 0;
    }
    else {
	if (s3cb2mllr_read(cb2mllrfn,
			   out_cb2mllr,
			   out_n_mgau,
			   &n_mllr_class_rd) != S3_SUCCESS) {
	    E_FATAL("Unable to read %s\n", cb2mllrfn);
	}
    }
    if (n_mllr_class_rd != *out_n_mllr_class) {
	E_FATAL("# MLLR class, %u, inconsistent w/ cb2mllr # MLLR class, %u\n",
		n_mllr_class_rd, *out_n_mllr_class);
    }
    return S3_SUCCESS;
}